

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

UploadSampleAnalyzeResult
deqp::gles3::Performance::anon_unknown_1::
analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
          (TestLog *log,
          vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
          *samples,bool logBucketPerformance)

{
  pointer *ppUVar1;
  uint uVar2;
  pointer pUVar3;
  pointer pUVar4;
  deUint64 dVar5;
  deUint64 dVar6;
  deUint64 dVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  deUint64 dVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  TestLog *pTVar16;
  uint uVar17;
  SampleBuilder *pSVar18;
  ulong uVar19;
  pointer pUVar20;
  string *psVar21;
  offset_in_SampleType_to_deUint64 in_RCX;
  long lVar22;
  LogNumber<float> *pLVar23;
  ulong uVar24;
  int numBytes;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  long lVar25;
  pointer pUVar26;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *__buf_14;
  void *__buf_15;
  void *__buf_16;
  void *__buf_17;
  void *__buf_18;
  void *__buf_19;
  void *__buf_20;
  void *__buf_21;
  void *__buf_22;
  void *__buf_23;
  void *__buf_24;
  void *__buf_25;
  void *__buf_26;
  void *__buf_27;
  void *__buf_28;
  void *__buf_29;
  void *__buf_30;
  void *__buf_31;
  void *__buf_32;
  void *__buf_33;
  void *__buf_34;
  void *__buf_35;
  void *__buf_36;
  void *__buf_37;
  void *__buf_38;
  void *__buf_39;
  void *__buf_40;
  void *__buf_41;
  void *__buf_42;
  void *__buf_43;
  void *__buf_44;
  void *__buf_45;
  void *__buf_46;
  void *__buf_47;
  void *__buf_48;
  void *__buf_49;
  void *__buf_50;
  void *__buf_51;
  void *__buf_52;
  void *__buf_53;
  void *__buf_54;
  void *__buf_55;
  void *__buf_56;
  void *__buf_57;
  void *__buf_58;
  void *__buf_59;
  void *__buf_60;
  void *__buf_61;
  void *__buf_62;
  void *__buf_63;
  uint uVar27;
  long lVar28;
  ulong uVar29;
  int iVar30;
  offset_in_SampleType_to_deUint64 in_R9;
  long lVar31;
  undefined8 *puVar32;
  size_t __n;
  long *plVar33;
  ulong uVar34;
  uint uVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar41 [12];
  UploadSampleAnalyzeResult UVar42;
  allocator<char> local_bea;
  allocator<char> local_be9;
  allocator<char> local_be8;
  allocator<char> local_be7;
  allocator<char> local_be6;
  allocator<char> local_be5;
  allocator<char> local_be4;
  allocator<char> local_be3;
  allocator<char> local_be2;
  allocator<char> local_be1;
  allocator<char> local_be0;
  allocator<char> local_bdf;
  allocator<char> local_bde;
  allocator<char> local_bdd;
  allocator<char> local_bdc;
  allocator<char> local_bdb;
  allocator<char> local_bda;
  allocator<char> local_bd9;
  allocator<char> local_bd8;
  allocator<char> local_bd7;
  allocator<char> local_bd6;
  allocator<char> local_bd5;
  allocator<char> local_bd4;
  allocator<char> local_bd3;
  allocator<char> local_bd2;
  allocator<char> local_bd1;
  allocator<char> local_bd0;
  allocator<char> local_bcf;
  allocator<char> local_bce;
  allocator<char> local_bcd;
  allocator<char> local_bcc;
  allocator<char> local_bcb;
  allocator<char> local_bca;
  allocator<char> local_bc9;
  long local_bc8;
  string local_bc0;
  string local_ba0;
  allocator<char> local_b7a;
  allocator<char> local_b79;
  string local_b78;
  string local_b58;
  string local_b38;
  string local_b18;
  string local_af8;
  string local_ad8;
  undefined1 local_ab8 [16];
  ScopedLogSection section_1;
  StatsType stats;
  string local_a18;
  undefined1 local_9f8 [104];
  pointer local_990;
  long local_988;
  string local_980;
  string local_960;
  string local_940;
  string local_920;
  string local_900;
  string local_8e0;
  string local_8c0;
  string local_8a0;
  float local_880;
  float local_87c;
  float local_878;
  float local_874;
  float local_870;
  float local_86c;
  float local_868;
  float local_864;
  ScopedLogSection section;
  string local_840;
  string local_820;
  string local_800;
  string local_7e0;
  LogNumber<float> local_7c0;
  LogNumber<float> local_758;
  LineParametersWithConfidence theilSenFitting;
  LogNumber<float> local_6d0;
  LogNumber<float> local_668;
  string local_600;
  LogNumber<float> local_5e0;
  LogNumber<float> local_578;
  LogNumber<float> local_510;
  undefined1 local_4a8 [16];
  TestLog *local_490;
  LogNumber<float> local_488;
  LogNumber<float> local_420;
  LineParametersWithConfidence contributionFitting;
  LogNumber<float> local_350;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  ScopedLogSection section_3;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
  buckets [4];
  string local_108;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  StatsType resultStats;
  
  local_ab8._8_8_ = local_ab8._0_8_;
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>>
            (&theilSenFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
              *)0x28,in_RCX);
  calculateSampleStatistics(&resultStats,&theilSenFitting,samples);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stats,"Samples",(allocator<char> *)&local_7c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_9f8,"Samples",(allocator<char> *)&local_758);
  psVar21 = (string *)local_9f8;
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&stats,psVar21);
  std::__cxx11::string::~string((string *)local_9f8);
  std::__cxx11::string::~string((string *)&stats);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_668,"Samples",(allocator<char> *)&local_600);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d0,"Samples",(allocator<char> *)&local_188);
  tcu::LogSampleList::LogSampleList((LogSampleList *)&local_420,&local_668.m_name,&local_6d0.m_name)
  ;
  iVar30 = (int)log;
  tcu::LogSampleList::write((LogSampleList *)&local_420,iVar30,__buf,(size_t)psVar21);
  tcu::TestLog::startSampleInfo(log);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_488,"WrittenSize",(allocator<char> *)&local_228);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&contributionFitting,"Written size",(allocator<char> *)&local_248);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)buckets,"bytes",(allocator<char> *)&local_1a8);
  psVar21 = (string *)buckets;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&stats,&local_488.m_name,(string *)&contributionFitting,psVar21,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::LogValueInfo::write((LogValueInfo *)&stats,iVar30,__buf_00,(size_t)psVar21);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b38,"BufferSize",(allocator<char> *)&local_268);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ad8,"Buffer size",(allocator<char> *)&local_288);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b58,"bytes",(allocator<char> *)&local_1c8);
  psVar21 = &local_b58;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_9f8,&local_b38,&local_ad8,psVar21,QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::LogValueInfo::write((LogValueInfo *)local_9f8,iVar30,__buf_01,(size_t)psVar21);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ba0,"TotalTime",(allocator<char> *)&local_2a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_af8,"Total time",(allocator<char> *)&local_2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b78,"us",(allocator<char> *)&local_1e8);
  psVar21 = &local_b78;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_7c0,&local_ba0,&local_af8,psVar21,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_7c0,iVar30,__buf_02,(size_t)psVar21);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bc0,"AllocTime",(allocator<char> *)&local_2e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b18,"Alloc time",(allocator<char> *)&section_3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a18,"us",(allocator<char> *)&local_108);
  psVar21 = &local_a18;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_758,&local_bc0,&local_b18,psVar21,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_758,iVar30,__buf_03,(size_t)psVar21);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8a0,"MapTime",(allocator<char> *)&section_1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c0,"Map time",&local_be0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7e0,"us",&local_be1);
  psVar21 = &local_7e0;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_5e0,&local_8a0,&local_8c0,psVar21,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_5e0,iVar30,__buf_04,(size_t)psVar21);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8e0,"UnmapTime",&local_be2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_900,"Unmap time",&local_be3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_800,"us",&local_be4);
  psVar21 = &local_800;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_350,&local_8e0,&local_900,psVar21,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_350,iVar30,__buf_05,(size_t)psVar21);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_920,"WriteTime",&local_be5);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_940,"Write time",&local_be6);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_820,"us",&local_be7);
  psVar21 = &local_820;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_578,&local_920,&local_940,psVar21,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_578,iVar30,__buf_06,(size_t)psVar21);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_960,"FitResidual",&local_be8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_980,"Fit residual",&local_be9)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_840,"us",&local_bea);
  psVar21 = &local_840;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_510,&local_960,&local_980,psVar21,QP_SAMPLE_VALUE_TAG_RESPONSE);
  local_ab8._0_8_ = samples;
  tcu::LogValueInfo::write((LogValueInfo *)&local_510,iVar30,__buf_07,(size_t)psVar21);
  tcu::TestLog::endSampleInfo(log);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_510);
  std::__cxx11::string::~string((string *)&local_840);
  std::__cxx11::string::~string((string *)&local_980);
  std::__cxx11::string::~string((string *)&local_960);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_578);
  std::__cxx11::string::~string((string *)&local_820);
  std::__cxx11::string::~string((string *)&local_940);
  std::__cxx11::string::~string((string *)&local_920);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_350);
  std::__cxx11::string::~string((string *)&local_800);
  std::__cxx11::string::~string((string *)&local_900);
  std::__cxx11::string::~string((string *)&local_8e0);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::__cxx11::string::~string((string *)&local_8a0);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_758);
  std::__cxx11::string::~string((string *)&local_a18);
  std::__cxx11::string::~string((string *)&local_b18);
  std::__cxx11::string::~string((string *)&local_bc0);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_7c0);
  std::__cxx11::string::~string((string *)&local_b78);
  std::__cxx11::string::~string((string *)&local_af8);
  std::__cxx11::string::~string((string *)&local_ba0);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)local_9f8);
  std::__cxx11::string::~string((string *)&local_b58);
  std::__cxx11::string::~string((string *)&local_ad8);
  std::__cxx11::string::~string((string *)&local_b38);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&stats);
  std::__cxx11::string::~string((string *)buckets);
  std::__cxx11::string::~string((string *)&contributionFitting);
  std::__cxx11::string::~string((string *)&local_488);
  tcu::LogSampleList::~LogSampleList((LogSampleList *)&local_420);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::__cxx11::string::~string((string *)&local_668);
  lVar31 = 0;
  lVar28 = 0;
  while( true ) {
    lVar22 = *(long *)local_ab8._0_8_;
    if ((int)((ulong)(*(long *)(local_ab8._0_8_ + 8) - lVar22) >> 6) <= lVar28) break;
    uVar24 = *(ulong *)(lVar22 + 0x38 + lVar31);
    local_bc8 = CONCAT44(local_bc8._4_4_,
                         (float)*(int *)(lVar22 + 8 + lVar31) * theilSenFitting.coefficient +
                         theilSenFitting.offset);
    stats._8_16_ = ZEXT416(0);
    stats.unmap.maxTime = 0.0;
    stats.unmap.medianTime = 0.0;
    stats.map._0_8_ = log;
    pSVar18 = tcu::SampleBuilder::operator<<((SampleBuilder *)&stats,*(int *)(lVar22 + 8 + lVar31));
    uVar8 = local_ab8._0_8_;
    pSVar18 = tcu::SampleBuilder::operator<<(pSVar18,*(int *)(*(long *)local_ab8._0_8_ + lVar31));
    pSVar18 = tcu::SampleBuilder::operator<<(pSVar18,*(int *)(*(long *)uVar8 + 0x30 + lVar31));
    pSVar18 = tcu::SampleBuilder::operator<<(pSVar18,*(int *)(*(long *)uVar8 + 0x28 + lVar31));
    pSVar18 = tcu::SampleBuilder::operator<<(pSVar18,*(int *)(*(long *)uVar8 + 0x10 + lVar31));
    pSVar18 = tcu::SampleBuilder::operator<<(pSVar18,*(int *)(*(long *)uVar8 + 0x18 + lVar31));
    pSVar18 = tcu::SampleBuilder::operator<<(pSVar18,*(int *)(*(long *)uVar8 + 0x20 + lVar31));
    pSVar18 = tcu::SampleBuilder::operator<<(pSVar18,(float)uVar24 - (float)local_bc8);
    tcu::SampleBuilder::operator<<(pSVar18,(EndSampleToken *)&tcu::TestLog::EndSample);
    std::_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>::
    ~_Vector_base((_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>
                   *)&stats.map.medianTime);
    lVar28 = lVar28 + 1;
    lVar31 = lVar31 + 0x40;
  }
  tcu::TestLog::endSampleList(log);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  buckets[3].
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  buckets[3].
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buckets[2].
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buckets[3].
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  buckets[2].
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  buckets[2].
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  buckets[1].
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  buckets[1].
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buckets[0].
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buckets[1].
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  buckets[0].
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  buckets[0].
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar28 = *(long *)local_ab8._0_8_;
  lVar31 = *(long *)(local_ab8._0_8_ + 8);
  lVar22 = (long)(int)((ulong)(lVar31 - lVar28) >> 6);
  lVar25 = 0;
  if (lVar22 < 1) {
    lVar22 = lVar25;
  }
  uVar27 = 0;
  uVar35 = 0;
  uVar17 = 0;
  for (; lVar22 * 0x40 != lVar25; lVar25 = lVar25 + 0x40) {
    uVar2 = *(uint *)(lVar28 + 4 + lVar25);
    in_R9 = (offset_in_SampleType_to_deUint64)uVar2;
    if ((int)uVar2 < (int)uVar27 || uVar27 == 0) {
      uVar17 = uVar35;
      uVar27 = uVar2;
    }
    if ((int)uVar17 < (int)uVar2 || uVar17 == 0) {
      uVar17 = uVar2;
      uVar35 = uVar2;
    }
  }
  fVar36 = (float)(int)(uVar35 - uVar27);
  lVar22 = 0;
  lVar25 = 0;
  local_4a8._0_4_ = uVar27;
  plVar33 = (long *)local_ab8._0_8_;
  local_490 = log;
  do {
    pTVar16 = local_490;
    if ((int)((ulong)(lVar31 - lVar28) >> 6) <= lVar25) {
      lVar28 = 0x48;
      lVar31 = 0;
      while (iVar30 = (int)pTVar16, lVar31 != 4) {
        if (buckets[lVar31].
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            buckets[lVar31].
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          lVar31 = lVar31 + 1;
        }
        else {
          calculateSampleStatistics(&stats,&theilSenFitting,buckets + lVar31);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_9f8,"BufferSizeRange",(allocator<char> *)&local_350);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_7c0,"Transfer performance with buffer size in range [",
                     (allocator<char> *)&local_578);
          Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
                    (&local_758.m_name,
                     (_anonymous_namespace_ *)
                     (ulong)(uint)((int)((float)(int)lVar31 * 0.25 * fVar36) + local_4a8._0_4_),
                     numBytes);
          auVar41 = std::__cxx11::string::append((char *)&local_758);
          local_bc8 = lVar31 + 1;
          Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
                    (&local_5e0.m_name,
                     (_anonymous_namespace_ *)
                     (ulong)(uint)((int)((float)(int)local_bc8 * 0.25 * fVar36) + local_4a8._0_4_),
                     auVar41._8_4_);
          std::__cxx11::string::append((char *)&local_5e0);
          std::__cxx11::string::append(auVar41._0_8_);
          psVar21 = (string *)std::__cxx11::string::append((string *)&local_7c0);
          tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar16,(string *)local_9f8,psVar21);
          std::__cxx11::string::~string((string *)&local_5e0);
          std::__cxx11::string::~string((string *)&local_758);
          std::__cxx11::string::~string((string *)&local_7c0);
          std::__cxx11::string::~string((string *)local_9f8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_578,"MapRangeMin",(allocator<char> *)&local_a18);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_510,"MapRange: Min time",(allocator<char> *)&local_8a0);
          pLVar23 = &local_420;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pLVar23,"us",(allocator<char> *)&local_8c0);
          tcu::LogNumber<float>::LogNumber
                    ((LogNumber<float> *)local_9f8,&local_578.m_name,&local_510.m_name,
                     &pLVar23->m_name,QP_KEY_TAG_TIME,stats.map.minTime);
          tcu::LogNumber<float>::write
                    ((LogNumber<float> *)local_9f8,iVar30,__buf_08,(size_t)pLVar23);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_668,"MapRangeMax",(allocator<char> *)&local_7e0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6d0,"MapRange: Max time",(allocator<char> *)&local_8e0);
          pLVar23 = &local_488;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pLVar23,"us",(allocator<char> *)&local_900);
          tcu::LogNumber<float>::LogNumber
                    (&local_7c0,&local_668.m_name,&local_6d0.m_name,&pLVar23->m_name,QP_KEY_TAG_TIME
                     ,stats.map.maxTime);
          tcu::LogNumber<float>::write(&local_7c0,iVar30,__buf_09,(size_t)pLVar23);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&contributionFitting,"MapRangeMin90",(allocator<char> *)&local_800);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b38,"MapRange: 90%-Min time",(allocator<char> *)&local_920);
          psVar21 = &local_ad8;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar21,"us",(allocator<char> *)&local_940);
          tcu::LogNumber<float>::LogNumber
                    (&local_758,(string *)&contributionFitting,&local_b38,psVar21,QP_KEY_TAG_TIME,
                     stats.map.min2DecileTime);
          tcu::LogNumber<float>::write(&local_758,iVar30,__buf_10,(size_t)psVar21);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b58,"MapRangeMax90",(allocator<char> *)&local_820);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ba0,"MapRange: 90%-Max time",(allocator<char> *)&local_960);
          psVar21 = &local_af8;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar21,"us",(allocator<char> *)&local_980);
          tcu::LogNumber<float>::LogNumber
                    (&local_5e0,&local_b58,&local_ba0,psVar21,QP_KEY_TAG_TIME,
                     stats.map.max9DecileTime);
          tcu::LogNumber<float>::write(&local_5e0,iVar30,__buf_11,(size_t)psVar21);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b78,"MapRangeMedian",(allocator<char> *)&local_840);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_bc0,"MapRange: Median time",(allocator<char> *)&section);
          psVar21 = &local_b18;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar21,"us",(allocator<char> *)&local_600);
          tcu::LogNumber<float>::LogNumber
                    (&local_350,&local_b78,&local_bc0,psVar21,QP_KEY_TAG_TIME,stats.map.medianTime);
          tcu::LogNumber<float>::write(&local_350,iVar30,__buf_12,(size_t)psVar21);
          tcu::LogNumber<float>::~LogNumber(&local_350);
          std::__cxx11::string::~string((string *)&local_b18);
          std::__cxx11::string::~string((string *)&local_bc0);
          std::__cxx11::string::~string((string *)&local_b78);
          tcu::LogNumber<float>::~LogNumber(&local_5e0);
          std::__cxx11::string::~string((string *)&local_af8);
          std::__cxx11::string::~string((string *)&local_ba0);
          std::__cxx11::string::~string((string *)&local_b58);
          tcu::LogNumber<float>::~LogNumber(&local_758);
          std::__cxx11::string::~string((string *)&local_ad8);
          std::__cxx11::string::~string((string *)&local_b38);
          std::__cxx11::string::~string((string *)&contributionFitting);
          tcu::LogNumber<float>::~LogNumber(&local_7c0);
          std::__cxx11::string::~string((string *)&local_488);
          std::__cxx11::string::~string((string *)&local_6d0);
          std::__cxx11::string::~string((string *)&local_668);
          tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)local_9f8);
          std::__cxx11::string::~string((string *)&local_420);
          std::__cxx11::string::~string((string *)&local_510);
          std::__cxx11::string::~string((string *)&local_578);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_578,"UnmapMin",(allocator<char> *)&local_a18);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_510,"Unmap: Min time",(allocator<char> *)&local_8a0);
          pLVar23 = &local_420;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pLVar23,"us",(allocator<char> *)&local_8c0);
          tcu::LogNumber<float>::LogNumber
                    ((LogNumber<float> *)local_9f8,&local_578.m_name,&local_510.m_name,
                     &pLVar23->m_name,QP_KEY_TAG_TIME,stats.unmap.minTime);
          tcu::LogNumber<float>::write
                    ((LogNumber<float> *)local_9f8,iVar30,__buf_13,(size_t)pLVar23);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_668,"UnmapMax",(allocator<char> *)&local_7e0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6d0,"Unmap: Max time",(allocator<char> *)&local_8e0);
          pLVar23 = &local_488;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pLVar23,"us",(allocator<char> *)&local_900);
          tcu::LogNumber<float>::LogNumber
                    (&local_7c0,&local_668.m_name,&local_6d0.m_name,&pLVar23->m_name,QP_KEY_TAG_TIME
                     ,stats.unmap.maxTime);
          tcu::LogNumber<float>::write(&local_7c0,iVar30,__buf_14,(size_t)pLVar23);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&contributionFitting,"UnmapMin90",(allocator<char> *)&local_800);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b38,"Unmap: 90%-Min time",(allocator<char> *)&local_920);
          psVar21 = &local_ad8;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar21,"us",(allocator<char> *)&local_940);
          tcu::LogNumber<float>::LogNumber
                    (&local_758,(string *)&contributionFitting,&local_b38,psVar21,QP_KEY_TAG_TIME,
                     stats.unmap.min2DecileTime);
          tcu::LogNumber<float>::write(&local_758,iVar30,__buf_15,(size_t)psVar21);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b58,"UnmapMax90",(allocator<char> *)&local_820);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ba0,"Unmap: 90%-Max time",(allocator<char> *)&local_960);
          psVar21 = &local_af8;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar21,"us",(allocator<char> *)&local_980);
          tcu::LogNumber<float>::LogNumber
                    (&local_5e0,&local_b58,&local_ba0,psVar21,QP_KEY_TAG_TIME,
                     stats.unmap.max9DecileTime);
          tcu::LogNumber<float>::write(&local_5e0,iVar30,__buf_16,(size_t)psVar21);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b78,"UnmapMedian",(allocator<char> *)&local_840);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_bc0,"Unmap: Median time",(allocator<char> *)&section);
          psVar21 = &local_b18;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar21,"us",(allocator<char> *)&local_600);
          tcu::LogNumber<float>::LogNumber
                    (&local_350,&local_b78,&local_bc0,psVar21,QP_KEY_TAG_TIME,stats.unmap.medianTime
                    );
          tcu::LogNumber<float>::write(&local_350,iVar30,__buf_17,(size_t)psVar21);
          tcu::LogNumber<float>::~LogNumber(&local_350);
          std::__cxx11::string::~string((string *)&local_b18);
          std::__cxx11::string::~string((string *)&local_bc0);
          std::__cxx11::string::~string((string *)&local_b78);
          tcu::LogNumber<float>::~LogNumber(&local_5e0);
          std::__cxx11::string::~string((string *)&local_af8);
          std::__cxx11::string::~string((string *)&local_ba0);
          std::__cxx11::string::~string((string *)&local_b58);
          tcu::LogNumber<float>::~LogNumber(&local_758);
          std::__cxx11::string::~string((string *)&local_ad8);
          std::__cxx11::string::~string((string *)&local_b38);
          std::__cxx11::string::~string((string *)&contributionFitting);
          tcu::LogNumber<float>::~LogNumber(&local_7c0);
          std::__cxx11::string::~string((string *)&local_488);
          std::__cxx11::string::~string((string *)&local_6d0);
          std::__cxx11::string::~string((string *)&local_668);
          tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)local_9f8);
          std::__cxx11::string::~string((string *)&local_420);
          std::__cxx11::string::~string((string *)&local_510);
          std::__cxx11::string::~string((string *)&local_578);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_578,"WriteMin",(allocator<char> *)&local_a18);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_510,"Write: Min time",(allocator<char> *)&local_8a0);
          pLVar23 = &local_420;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pLVar23,"us",(allocator<char> *)&local_8c0);
          tcu::LogNumber<float>::LogNumber
                    ((LogNumber<float> *)local_9f8,&local_578.m_name,&local_510.m_name,
                     &pLVar23->m_name,QP_KEY_TAG_TIME,stats.write.minTime);
          tcu::LogNumber<float>::write
                    ((LogNumber<float> *)local_9f8,iVar30,__buf_18,(size_t)pLVar23);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_668,"WriteMax",(allocator<char> *)&local_7e0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6d0,"Write: Max time",(allocator<char> *)&local_8e0);
          pLVar23 = &local_488;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pLVar23,"us",(allocator<char> *)&local_900);
          tcu::LogNumber<float>::LogNumber
                    (&local_7c0,&local_668.m_name,&local_6d0.m_name,&pLVar23->m_name,QP_KEY_TAG_TIME
                     ,stats.write.maxTime);
          tcu::LogNumber<float>::write(&local_7c0,iVar30,__buf_19,(size_t)pLVar23);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&contributionFitting,"WriteMin90",(allocator<char> *)&local_800);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b38,"Write: 90%-Min time",(allocator<char> *)&local_920);
          psVar21 = &local_ad8;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar21,"us",(allocator<char> *)&local_940);
          tcu::LogNumber<float>::LogNumber
                    (&local_758,(string *)&contributionFitting,&local_b38,psVar21,QP_KEY_TAG_TIME,
                     stats.write.min2DecileTime);
          tcu::LogNumber<float>::write(&local_758,iVar30,__buf_20,(size_t)psVar21);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b58,"WriteMax90",(allocator<char> *)&local_820);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ba0,"Write: 90%-Max time",(allocator<char> *)&local_960);
          psVar21 = &local_af8;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar21,"us",(allocator<char> *)&local_980);
          tcu::LogNumber<float>::LogNumber
                    (&local_5e0,&local_b58,&local_ba0,psVar21,QP_KEY_TAG_TIME,
                     stats.write.max9DecileTime);
          tcu::LogNumber<float>::write(&local_5e0,iVar30,__buf_21,(size_t)psVar21);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b78,"WriteMedian",(allocator<char> *)&local_840);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_bc0,"Write: Median time",(allocator<char> *)&section);
          psVar21 = &local_b18;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar21,"us",(allocator<char> *)&local_600);
          tcu::LogNumber<float>::LogNumber
                    (&local_350,&local_b78,&local_bc0,psVar21,QP_KEY_TAG_TIME,stats.write.medianTime
                    );
          tcu::LogNumber<float>::write(&local_350,iVar30,__buf_22,(size_t)psVar21);
          tcu::LogNumber<float>::~LogNumber(&local_350);
          std::__cxx11::string::~string((string *)&local_b18);
          std::__cxx11::string::~string((string *)&local_bc0);
          std::__cxx11::string::~string((string *)&local_b78);
          tcu::LogNumber<float>::~LogNumber(&local_5e0);
          std::__cxx11::string::~string((string *)&local_af8);
          std::__cxx11::string::~string((string *)&local_ba0);
          std::__cxx11::string::~string((string *)&local_b58);
          tcu::LogNumber<float>::~LogNumber(&local_758);
          std::__cxx11::string::~string((string *)&local_ad8);
          std::__cxx11::string::~string((string *)&local_b38);
          std::__cxx11::string::~string((string *)&contributionFitting);
          tcu::LogNumber<float>::~LogNumber(&local_7c0);
          std::__cxx11::string::~string((string *)&local_488);
          std::__cxx11::string::~string((string *)&local_6d0);
          std::__cxx11::string::~string((string *)&local_668);
          tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)local_9f8);
          std::__cxx11::string::~string((string *)&local_420);
          std::__cxx11::string::~string((string *)&local_510);
          std::__cxx11::string::~string((string *)&local_578);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_578,"AllocMin",(allocator<char> *)&local_a18);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_510,"Alloc: Min time",(allocator<char> *)&local_8a0);
          pLVar23 = &local_420;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pLVar23,"us",(allocator<char> *)&local_8c0);
          tcu::LogNumber<float>::LogNumber
                    ((LogNumber<float> *)local_9f8,&local_578.m_name,&local_510.m_name,
                     &pLVar23->m_name,QP_KEY_TAG_TIME,stats.alloc.minTime);
          tcu::LogNumber<float>::write
                    ((LogNumber<float> *)local_9f8,iVar30,__buf_23,(size_t)pLVar23);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_668,"AllocMax",(allocator<char> *)&local_7e0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6d0,"Alloc: Max time",(allocator<char> *)&local_8e0);
          pLVar23 = &local_488;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pLVar23,"us",(allocator<char> *)&local_900);
          tcu::LogNumber<float>::LogNumber
                    (&local_7c0,&local_668.m_name,&local_6d0.m_name,&pLVar23->m_name,QP_KEY_TAG_TIME
                     ,stats.alloc.maxTime);
          tcu::LogNumber<float>::write(&local_7c0,iVar30,__buf_24,(size_t)pLVar23);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&contributionFitting,"AllocMin90",(allocator<char> *)&local_800);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b38,"Alloc: 90%-Min time",(allocator<char> *)&local_920);
          psVar21 = &local_ad8;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar21,"us",(allocator<char> *)&local_940);
          tcu::LogNumber<float>::LogNumber
                    (&local_758,(string *)&contributionFitting,&local_b38,psVar21,QP_KEY_TAG_TIME,
                     stats.alloc.min2DecileTime);
          tcu::LogNumber<float>::write(&local_758,iVar30,__buf_25,(size_t)psVar21);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b58,"AllocMax90",(allocator<char> *)&local_820);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ba0,"Alloc: 90%-Max time",(allocator<char> *)&local_960);
          psVar21 = &local_af8;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar21,"us",(allocator<char> *)&local_980);
          tcu::LogNumber<float>::LogNumber
                    (&local_5e0,&local_b58,&local_ba0,psVar21,QP_KEY_TAG_TIME,
                     stats.alloc.max9DecileTime);
          tcu::LogNumber<float>::write(&local_5e0,iVar30,__buf_26,(size_t)psVar21);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b78,"AllocMedian",(allocator<char> *)&local_840);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_bc0,"Alloc: Median time",(allocator<char> *)&section);
          psVar21 = &local_b18;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar21,"us",(allocator<char> *)&local_600);
          tcu::LogNumber<float>::LogNumber
                    (&local_350,&local_b78,&local_bc0,psVar21,QP_KEY_TAG_TIME,stats.alloc.medianTime
                    );
          tcu::LogNumber<float>::write(&local_350,iVar30,__buf_27,(size_t)psVar21);
          tcu::LogNumber<float>::~LogNumber(&local_350);
          std::__cxx11::string::~string((string *)&local_b18);
          std::__cxx11::string::~string((string *)&local_bc0);
          std::__cxx11::string::~string((string *)&local_b78);
          tcu::LogNumber<float>::~LogNumber(&local_5e0);
          std::__cxx11::string::~string((string *)&local_af8);
          std::__cxx11::string::~string((string *)&local_ba0);
          std::__cxx11::string::~string((string *)&local_b58);
          tcu::LogNumber<float>::~LogNumber(&local_758);
          std::__cxx11::string::~string((string *)&local_ad8);
          std::__cxx11::string::~string((string *)&local_b38);
          std::__cxx11::string::~string((string *)&contributionFitting);
          tcu::LogNumber<float>::~LogNumber(&local_7c0);
          std::__cxx11::string::~string((string *)&local_488);
          std::__cxx11::string::~string((string *)&local_6d0);
          std::__cxx11::string::~string((string *)&local_668);
          tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)local_9f8);
          std::__cxx11::string::~string((string *)&local_420);
          std::__cxx11::string::~string((string *)&local_510);
          std::__cxx11::string::~string((string *)&local_578);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_b38,"Min",&local_be0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ad8,"Total: Min time",&local_be1);
          psVar21 = &local_b58;
          std::__cxx11::string::string<std::allocator<char>>((string *)psVar21,"us",&local_be2);
          tcu::LogNumber<float>::LogNumber
                    ((LogNumber<float> *)local_9f8,&local_b38,&local_ad8,psVar21,QP_KEY_TAG_TIME,
                     stats.result.minTime);
          tcu::LogNumber<float>::write
                    ((LogNumber<float> *)local_9f8,iVar30,__buf_28,(size_t)psVar21);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_ba0,"Max",&local_be3);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_af8,"Total: Max time",&local_be4);
          psVar21 = &local_b78;
          std::__cxx11::string::string<std::allocator<char>>((string *)psVar21,"us",&local_be5);
          tcu::LogNumber<float>::LogNumber
                    (&local_7c0,&local_ba0,&local_af8,psVar21,QP_KEY_TAG_TIME,stats.result.maxTime);
          tcu::LogNumber<float>::write(&local_7c0,iVar30,__buf_29,(size_t)psVar21);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_bc0,"Min90",&local_be6);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b18,"Total: 90%-Min time",&local_be7);
          psVar21 = &local_a18;
          std::__cxx11::string::string<std::allocator<char>>((string *)psVar21,"us",&local_be8);
          tcu::LogNumber<float>::LogNumber
                    (&local_758,&local_bc0,&local_b18,psVar21,QP_KEY_TAG_TIME,
                     stats.result.min2DecileTime);
          tcu::LogNumber<float>::write(&local_758,iVar30,__buf_30,(size_t)psVar21);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_8a0,"Max90",&local_be9);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_8c0,"Total: 90%-Max time",&local_bea);
          psVar21 = &local_7e0;
          std::__cxx11::string::string<std::allocator<char>>((string *)psVar21,"us",&local_bc9);
          tcu::LogNumber<float>::LogNumber
                    (&local_5e0,&local_8a0,&local_8c0,psVar21,QP_KEY_TAG_TIME,
                     stats.result.max9DecileTime);
          tcu::LogNumber<float>::write(&local_5e0,iVar30,__buf_31,(size_t)psVar21);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_8e0,"Median",&local_bca);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_900,"Total: Median time",&local_bcb);
          psVar21 = &local_800;
          std::__cxx11::string::string<std::allocator<char>>((string *)psVar21,"us",&local_bcc);
          tcu::LogNumber<float>::LogNumber
                    (&local_350,&local_8e0,&local_900,psVar21,QP_KEY_TAG_TIME,
                     stats.result.medianTime);
          tcu::LogNumber<float>::write(&local_350,iVar30,__buf_32,(size_t)psVar21);
          psVar21 = &local_820;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_920,"MedianTransfer",&local_bcd);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_940,"Median transfer rate",&local_bce);
          std::__cxx11::string::string<std::allocator<char>>((string *)psVar21,"MB / s",&local_bcf);
          tcu::LogNumber<float>::LogNumber
                    (&local_578,&local_920,&local_940,psVar21,QP_KEY_TAG_PERFORMANCE,
                     stats.medianRate * 0.0009765625 * 0.0009765625);
          tcu::LogNumber<float>::write(&local_578,iVar30,__buf_33,(size_t)psVar21);
          psVar21 = &local_840;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_960,"MaxDiff",&local_bd0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_980,"Max difference to approximated",&local_bd1);
          std::__cxx11::string::string<std::allocator<char>>((string *)psVar21,"us",&local_bd2);
          tcu::LogNumber<float>::LogNumber
                    (&local_510,&local_960,&local_980,psVar21,QP_KEY_TAG_TIME,stats.maxDiffTime);
          tcu::LogNumber<float>::write(&local_510,iVar30,__buf_34,(size_t)psVar21);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&section,"Max90Diff",&local_bd3);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_600,"90%-Max difference to approximated",&local_bd4);
          psVar21 = &local_188;
          std::__cxx11::string::string<std::allocator<char>>((string *)psVar21,"us",&local_bd5);
          tcu::LogNumber<float>::LogNumber
                    (&local_420,(string *)&section,&local_600,psVar21,QP_KEY_TAG_TIME,
                     stats.maxDiff9DecileTime);
          tcu::LogNumber<float>::write(&local_420,iVar30,__buf_35,(size_t)psVar21);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_228,"MedianDiff",&local_bd6);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_248,"Median difference to approximated",&local_bd7);
          psVar21 = &local_1a8;
          std::__cxx11::string::string<std::allocator<char>>((string *)psVar21,"us",&local_bd8);
          tcu::LogNumber<float>::LogNumber
                    (&local_668,&local_228,&local_248,psVar21,QP_KEY_TAG_TIME,stats.medianDiffTime);
          tcu::LogNumber<float>::write(&local_668,iVar30,__buf_36,(size_t)psVar21);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_268,"MaxRelDiff",&local_bd9);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_288,"Max relative difference to approximated",&local_bda);
          psVar21 = &local_1c8;
          std::__cxx11::string::string<std::allocator<char>>((string *)psVar21,"%",&local_bdb);
          tcu::LogNumber<float>::LogNumber
                    (&local_6d0,&local_268,&local_288,psVar21,QP_KEY_TAG_NONE,
                     stats.maxRelDiffTime * 100.0);
          tcu::LogNumber<float>::write(&local_6d0,iVar30,__buf_37,(size_t)psVar21);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2a8,"Max90RelDiff",&local_bdc);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2c8,"90%-Max relative difference to approximated",&local_bdd);
          psVar21 = &local_1e8;
          std::__cxx11::string::string<std::allocator<char>>((string *)psVar21,"%",&local_bde);
          tcu::LogNumber<float>::LogNumber
                    (&local_488,&local_2a8,&local_2c8,psVar21,QP_KEY_TAG_NONE,
                     stats.max9DecileRelDiffTime * 100.0);
          tcu::LogNumber<float>::write(&local_488,iVar30,__buf_38,(size_t)psVar21);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2e8,"MedianRelDiff",&local_bdf);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&section_3,"Median relative difference to approximated",&local_b79);
          psVar21 = &local_108;
          std::__cxx11::string::string<std::allocator<char>>((string *)psVar21,"%",&local_b7a);
          tcu::LogNumber<float>::LogNumber
                    ((LogNumber<float> *)&contributionFitting,&local_2e8,(string *)&section_3,
                     psVar21,QP_KEY_TAG_NONE,stats.medianRelDiffTime * 100.0);
          tcu::LogNumber<float>::write
                    ((LogNumber<float> *)&contributionFitting,iVar30,__buf_39,(size_t)psVar21);
          tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&contributionFitting);
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)&section_3);
          std::__cxx11::string::~string((string *)&local_2e8);
          tcu::LogNumber<float>::~LogNumber(&local_488);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::__cxx11::string::~string((string *)&local_2c8);
          std::__cxx11::string::~string((string *)&local_2a8);
          tcu::LogNumber<float>::~LogNumber(&local_6d0);
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::string::~string((string *)&local_288);
          std::__cxx11::string::~string((string *)&local_268);
          tcu::LogNumber<float>::~LogNumber(&local_668);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::__cxx11::string::~string((string *)&local_248);
          std::__cxx11::string::~string((string *)&local_228);
          tcu::LogNumber<float>::~LogNumber(&local_420);
          std::__cxx11::string::~string((string *)&local_188);
          std::__cxx11::string::~string((string *)&local_600);
          std::__cxx11::string::~string((string *)&section);
          tcu::LogNumber<float>::~LogNumber(&local_510);
          std::__cxx11::string::~string((string *)&local_840);
          std::__cxx11::string::~string((string *)&local_980);
          std::__cxx11::string::~string((string *)&local_960);
          tcu::LogNumber<float>::~LogNumber(&local_578);
          std::__cxx11::string::~string((string *)&local_820);
          std::__cxx11::string::~string((string *)&local_940);
          std::__cxx11::string::~string((string *)&local_920);
          tcu::LogNumber<float>::~LogNumber(&local_350);
          std::__cxx11::string::~string((string *)&local_800);
          std::__cxx11::string::~string((string *)&local_900);
          std::__cxx11::string::~string((string *)&local_8e0);
          tcu::LogNumber<float>::~LogNumber(&local_5e0);
          std::__cxx11::string::~string((string *)&local_7e0);
          std::__cxx11::string::~string((string *)&local_8c0);
          std::__cxx11::string::~string((string *)&local_8a0);
          tcu::LogNumber<float>::~LogNumber(&local_758);
          std::__cxx11::string::~string((string *)&local_a18);
          std::__cxx11::string::~string((string *)&local_b18);
          std::__cxx11::string::~string((string *)&local_bc0);
          tcu::LogNumber<float>::~LogNumber(&local_7c0);
          std::__cxx11::string::~string((string *)&local_b78);
          std::__cxx11::string::~string((string *)&local_af8);
          std::__cxx11::string::~string((string *)&local_ba0);
          tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)local_9f8);
          std::__cxx11::string::~string((string *)&local_b58);
          std::__cxx11::string::~string((string *)&local_ad8);
          std::__cxx11::string::~string((string *)&local_b38);
          tcu::ScopedLogSection::~ScopedLogSection(&section_1);
          lVar31 = local_bc8;
        }
      }
      do {
        std::
        vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
        ::~vector((vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                   *)((long)&buckets[0].
                             super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar28));
        lVar28 = lVar28 + -0x18;
      } while (lVar28 != -0x18);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stats,"Contribution",(allocator<char> *)&local_7c0);
      uVar8 = local_ab8._0_8_;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_9f8,"Contributions",(allocator<char> *)&local_758);
      psVar21 = (string *)local_9f8;
      tcu::ScopedLogSection::ScopedLogSection
                ((ScopedLogSection *)buckets,pTVar16,(string *)&stats,psVar21);
      std::__cxx11::string::~string((string *)local_9f8);
      std::__cxx11::string::~string((string *)&stats);
      Performance::(anonymous_namespace)::
      fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>>
                (&contributionFitting,(_anonymous_namespace_ *)uVar8,
                 (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                  *)0x0,(offset_in_SampleType_to_deUint64)psVar21);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_758,"MapConstantCost",(allocator<char> *)&local_b38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5e0,"Map: Approximated contant cost",(allocator<char> *)&local_ad8
                );
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_350,"us",(allocator<char> *)&local_b58);
      pLVar23 = &local_350;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&stats,&local_758.m_name,&local_5e0.m_name,&pLVar23->m_name,
                 QP_KEY_TAG_TIME,contributionFitting.offset);
      tcu::LogNumber<float>::write((LogNumber<float> *)&stats,iVar30,__buf_40,(size_t)pLVar23);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_578,"MapLinearCost",(allocator<char> *)&local_ba0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_510,"Map: Approximated linear cost",(allocator<char> *)&local_af8)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_420,"us / MB",(allocator<char> *)&local_b78);
      pLVar23 = &local_420;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_9f8,&local_578.m_name,&local_510.m_name,&pLVar23->m_name,
                 QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)local_9f8,iVar30,__buf_41,(size_t)pLVar23);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_668,"MapMedianCost",(allocator<char> *)&local_bc0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6d0,"Map: Median cost",(allocator<char> *)&local_b18);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_488,"us",(allocator<char> *)&local_a18);
      pLVar23 = &local_488;
      tcu::LogNumber<float>::LogNumber
                (&local_7c0,&local_668.m_name,&local_6d0.m_name,&pLVar23->m_name,QP_KEY_TAG_TIME,
                 resultStats.map.medianTime);
      tcu::LogNumber<float>::write(&local_7c0,iVar30,__buf_42,(size_t)pLVar23);
      tcu::LogNumber<float>::~LogNumber(&local_7c0);
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::~string((string *)&local_6d0);
      std::__cxx11::string::~string((string *)&local_668);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)local_9f8);
      std::__cxx11::string::~string((string *)&local_420);
      std::__cxx11::string::~string((string *)&local_510);
      std::__cxx11::string::~string((string *)&local_578);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&stats);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_5e0);
      std::__cxx11::string::~string((string *)&local_758);
      Performance::(anonymous_namespace)::
      fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>>
                (&contributionFitting,(_anonymous_namespace_ *)uVar8,
                 (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                  *)0x8,(offset_in_SampleType_to_deUint64)pLVar23);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_758,"UnmapConstantCost",(allocator<char> *)&local_b38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5e0,"Unmap: Approximated contant cost",
                 (allocator<char> *)&local_ad8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_350,"us",(allocator<char> *)&local_b58);
      pLVar23 = &local_350;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&stats,&local_758.m_name,&local_5e0.m_name,&pLVar23->m_name,
                 QP_KEY_TAG_TIME,contributionFitting.offset);
      tcu::LogNumber<float>::write((LogNumber<float> *)&stats,iVar30,__buf_43,(size_t)pLVar23);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_578,"UnmapLinearCost",(allocator<char> *)&local_ba0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_510,"Unmap: Approximated linear cost",
                 (allocator<char> *)&local_af8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_420,"us / MB",(allocator<char> *)&local_b78);
      pLVar23 = &local_420;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_9f8,&local_578.m_name,&local_510.m_name,&pLVar23->m_name,
                 QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)local_9f8,iVar30,__buf_44,(size_t)pLVar23);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_668,"UnmapMedianCost",(allocator<char> *)&local_bc0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6d0,"Unmap: Median cost",(allocator<char> *)&local_b18);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_488,"us",(allocator<char> *)&local_a18);
      pLVar23 = &local_488;
      tcu::LogNumber<float>::LogNumber
                (&local_7c0,&local_668.m_name,&local_6d0.m_name,&pLVar23->m_name,QP_KEY_TAG_TIME,
                 resultStats.unmap.medianTime);
      tcu::LogNumber<float>::write(&local_7c0,iVar30,__buf_45,(size_t)pLVar23);
      tcu::LogNumber<float>::~LogNumber(&local_7c0);
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::~string((string *)&local_6d0);
      std::__cxx11::string::~string((string *)&local_668);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)local_9f8);
      std::__cxx11::string::~string((string *)&local_420);
      std::__cxx11::string::~string((string *)&local_510);
      std::__cxx11::string::~string((string *)&local_578);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&stats);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_5e0);
      std::__cxx11::string::~string((string *)&local_758);
      Performance::(anonymous_namespace)::
      fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>>
                (&contributionFitting,(_anonymous_namespace_ *)uVar8,
                 (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                  *)0x10,(offset_in_SampleType_to_deUint64)pLVar23);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_758,"WriteConstantCost",(allocator<char> *)&local_b38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5e0,"Write: Approximated contant cost",
                 (allocator<char> *)&local_ad8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_350,"us",(allocator<char> *)&local_b58);
      pLVar23 = &local_350;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&stats,&local_758.m_name,&local_5e0.m_name,&pLVar23->m_name,
                 QP_KEY_TAG_TIME,contributionFitting.offset);
      tcu::LogNumber<float>::write((LogNumber<float> *)&stats,iVar30,__buf_46,(size_t)pLVar23);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_578,"WriteLinearCost",(allocator<char> *)&local_ba0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_510,"Write: Approximated linear cost",
                 (allocator<char> *)&local_af8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_420,"us / MB",(allocator<char> *)&local_b78);
      pLVar23 = &local_420;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_9f8,&local_578.m_name,&local_510.m_name,&pLVar23->m_name,
                 QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)local_9f8,iVar30,__buf_47,(size_t)pLVar23);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_668,"WriteMedianCost",(allocator<char> *)&local_bc0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6d0,"Write: Median cost",(allocator<char> *)&local_b18);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_488,"us",(allocator<char> *)&local_a18);
      pLVar23 = &local_488;
      tcu::LogNumber<float>::LogNumber
                (&local_7c0,&local_668.m_name,&local_6d0.m_name,&pLVar23->m_name,QP_KEY_TAG_TIME,
                 resultStats.write.medianTime);
      tcu::LogNumber<float>::write(&local_7c0,iVar30,__buf_48,(size_t)pLVar23);
      tcu::LogNumber<float>::~LogNumber(&local_7c0);
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::~string((string *)&local_6d0);
      std::__cxx11::string::~string((string *)&local_668);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)local_9f8);
      std::__cxx11::string::~string((string *)&local_420);
      std::__cxx11::string::~string((string *)&local_510);
      std::__cxx11::string::~string((string *)&local_578);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&stats);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_5e0);
      std::__cxx11::string::~string((string *)&local_758);
      Performance::(anonymous_namespace)::
      fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>>
                (&contributionFitting,(_anonymous_namespace_ *)uVar8,
                 (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                  *)0x18,(offset_in_SampleType_to_deUint64)pLVar23);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_758,"AllocConstantCost",(allocator<char> *)&local_b38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5e0,"Alloc: Approximated contant cost",
                 (allocator<char> *)&local_ad8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_350,"us",(allocator<char> *)&local_b58);
      pLVar23 = &local_350;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&stats,&local_758.m_name,&local_5e0.m_name,&pLVar23->m_name,
                 QP_KEY_TAG_TIME,contributionFitting.offset);
      tcu::LogNumber<float>::write((LogNumber<float> *)&stats,iVar30,__buf_49,(size_t)pLVar23);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_578,"AllocLinearCost",(allocator<char> *)&local_ba0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_510,"Alloc: Approximated linear cost",
                 (allocator<char> *)&local_af8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_420,"us / MB",(allocator<char> *)&local_b78);
      pLVar23 = &local_420;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_9f8,&local_578.m_name,&local_510.m_name,&pLVar23->m_name,
                 QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)local_9f8,iVar30,__buf_50,(size_t)pLVar23);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_668,"AllocMedianCost",(allocator<char> *)&local_bc0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6d0,"Alloc: Median cost",(allocator<char> *)&local_b18);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_488,"us",(allocator<char> *)&local_a18);
      pLVar23 = &local_488;
      tcu::LogNumber<float>::LogNumber
                (&local_7c0,&local_668.m_name,&local_6d0.m_name,&pLVar23->m_name,QP_KEY_TAG_TIME,
                 resultStats.alloc.medianTime);
      tcu::LogNumber<float>::write(&local_7c0,iVar30,__buf_51,(size_t)pLVar23);
      tcu::LogNumber<float>::~LogNumber(&local_7c0);
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::~string((string *)&local_6d0);
      std::__cxx11::string::~string((string *)&local_668);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)local_9f8);
      std::__cxx11::string::~string((string *)&local_420);
      std::__cxx11::string::~string((string *)&local_510);
      std::__cxx11::string::~string((string *)&local_578);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&stats);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_5e0);
      std::__cxx11::string::~string((string *)&local_758);
      tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)buckets);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stats,"Results",(allocator<char> *)&local_7c0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_9f8,"Results",(allocator<char> *)&local_758);
      tcu::ScopedLogSection::ScopedLogSection
                (&section_3,pTVar16,(string *)&stats,(string *)local_9f8);
      std::__cxx11::string::~string((string *)local_9f8);
      std::__cxx11::string::~string((string *)&stats);
      fVar38 = (float)((*(int *)(*(long *)(uVar8 + 8) + -0x40) + **(int **)uVar8) / 2);
      local_880 = theilSenFitting.coefficient * fVar38;
      local_87c = theilSenFitting.offset + local_880;
      uVar24 = (ulong)(*(long *)(uVar8 + 8) - (long)*(int **)uVar8) >> 6;
      uVar24 = (long)((ulong)(uint)((int)uVar24 >> 0x1f) << 0x20 | uVar24 & 0xffffffff) / 2;
      Performance::(anonymous_namespace)::
      fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>>
                ((LineParametersWithConfidence *)&stats,(_anonymous_namespace_ *)uVar8,
                 (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                  *)0x0,(int)uVar24,0x28,in_R9);
      Performance::(anonymous_namespace)::
      fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>>
                ((LineParametersWithConfidence *)local_9f8,(_anonymous_namespace_ *)uVar8,
                 (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                  *)(uVar24 & 0xffffffff),(int)((ulong)(*(long *)(uVar8 + 8) - *(long *)uVar8) >> 6)
                 ,0x28,in_R9);
      lVar28 = *(long *)uVar8;
      lVar31 = *(long *)(uVar8 + 8);
      fVar36 = (float)*(int *)(lVar28 + 8);
      fVar37 = (float)*(int *)(lVar31 + -0x38);
      local_bc8 = CONCAT44(local_bc8._4_4_,fVar36);
      local_988 = CONCAT44(local_988._4_4_,fVar37);
      local_868 = stats.map.minTime;
      local_4a8 = ZEXT416((uint)stats.map.min2DecileTime);
      local_864 = (float)local_9f8._0_4_;
      local_c8 = ZEXT416((uint)local_9f8._12_4_);
      fVar36 = getAreaBetweenLines(fVar36,fVar37,stats.map.minTime,stats.map.min2DecileTime,
                                   (float)local_9f8._0_4_,(float)local_9f8._12_4_);
      local_990 = (pointer)CONCAT44(local_990._4_4_,fVar36);
      fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
                ((LineParametersWithConfidence *)&stats,
                 (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                  *)uVar8,0,(int)((ulong)(lVar31 - lVar28) >> 6),2,0x28);
      fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
                ((LineParametersWithConfidence *)local_9f8,
                 (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                  *)uVar8,1,(int)((ulong)(*(long *)(uVar8 + 8) - *(long *)uVar8) >> 6),2,0x28);
      local_86c = (float)*(int *)(*(long *)(uVar8 + 8) + -0x38);
      local_ab8._0_4_ = (float)*(int *)(*(long *)uVar8 + 8);
      local_878 = stats.map.minTime;
      local_d8 = ZEXT416((uint)stats.map.min2DecileTime);
      local_874 = (float)local_9f8._0_4_;
      local_e8 = ZEXT416((uint)local_9f8._12_4_);
      local_870 = getAreaBetweenLines((float)*(int *)(*(long *)uVar8 + 8),local_86c,
                                      stats.map.minTime,stats.map.min2DecileTime,
                                      (float)local_9f8._0_4_,(float)local_9f8._12_4_);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&contributionFitting,"ResultLinearity",(allocator<char> *)&local_108);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)buckets,"Sample linearity",(allocator<char> *)&section_1);
      pTVar16 = local_490;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b38,"%",&local_be0);
      fVar36 = (float)local_4a8._0_4_ * (float)local_bc8 + local_868;
      fVar37 = (float)local_c8._0_4_ * (float)local_bc8 + local_864;
      uVar17 = -(uint)(fVar36 <= fVar37);
      fVar39 = (float)local_4a8._0_4_ * (float)local_988 + local_868;
      fVar40 = (float)local_c8._0_4_ * (float)local_988 + local_864;
      uVar35 = -(uint)(fVar40 <= fVar39);
      fVar36 = ((float)(~uVar35 & (uint)fVar40 | (uint)fVar39 & uVar35) -
               (float)(~uVar17 & (uint)fVar37 | (uint)fVar36 & uVar17)) *
               ((float)local_988 - (float)local_bc8);
      fVar37 = (float)(~-(uint)(fVar36 < 1e-06) & (uint)(1.0 - local_990._0_4_ / fVar36));
      fVar36 = 1.0;
      if (fVar37 <= 1.0) {
        fVar36 = fVar37;
      }
      psVar21 = &local_b38;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&stats,(string *)&contributionFitting,(string *)buckets,psVar21
                 ,QP_KEY_TAG_QUALITY,(float)(~-(uint)(fVar37 < 0.0) & (uint)(fVar36 * 100.0)));
      iVar30 = (int)pTVar16;
      tcu::LogNumber<float>::write((LogNumber<float> *)&stats,iVar30,__buf_52,(size_t)psVar21);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ad8,"SampleTemporalStability",&local_be1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b58,"Sample temporal stability",&local_be2);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_ba0,"%",&local_be3);
      fVar36 = (float)local_d8._0_4_ * (float)local_ab8._0_4_ + local_878;
      fVar37 = (float)local_e8._0_4_ * (float)local_ab8._0_4_ + local_874;
      uVar17 = -(uint)(fVar36 <= fVar37);
      fVar39 = (float)local_d8._0_4_ * local_86c + local_878;
      fVar40 = (float)local_e8._0_4_ * local_86c + local_874;
      uVar35 = -(uint)(fVar40 <= fVar39);
      fVar36 = ((float)(~uVar35 & (uint)fVar40 | (uint)fVar39 & uVar35) -
               (float)(~uVar17 & (uint)fVar37 | (uint)fVar36 & uVar17)) *
               (local_86c - (float)local_ab8._0_4_);
      fVar37 = (float)(~-(uint)(fVar36 < 1e-06) & (uint)(1.0 - local_870 / fVar36));
      fVar36 = 1.0;
      if (fVar37 <= 1.0) {
        fVar36 = fVar37;
      }
      psVar21 = &local_ba0;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_9f8,&local_ad8,&local_b58,psVar21,QP_KEY_TAG_QUALITY,
                 (float)(~-(uint)(fVar37 < 0.0) & (uint)(fVar36 * 100.0)));
      tcu::LogNumber<float>::write((LogNumber<float> *)local_9f8,iVar30,__buf_53,(size_t)psVar21);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_af8,"ApproximatedConstantCost",&local_be4);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b78,"Approximated contant cost",&local_be5);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_bc0,"us",&local_be6);
      psVar21 = &local_bc0;
      tcu::LogNumber<float>::LogNumber
                (&local_7c0,&local_af8,&local_b78,psVar21,QP_KEY_TAG_TIME,theilSenFitting.offset);
      tcu::LogNumber<float>::write(&local_7c0,iVar30,__buf_54,(size_t)psVar21);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b18,"ApproximatedConstantCostConfidence60Lower",&local_be7);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a18,"Approximated contant cost 60% confidence lower limit",
                 &local_be8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a0,"us",&local_be9);
      psVar21 = &local_8a0;
      tcu::LogNumber<float>::LogNumber
                (&local_758,&local_b18,&local_a18,psVar21,QP_KEY_TAG_TIME,
                 theilSenFitting.offsetConfidenceLower);
      tcu::LogNumber<float>::write(&local_758,iVar30,__buf_55,(size_t)psVar21);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8c0,"ApproximatedConstantCostConfidence60Upper",&local_bea);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7e0,"Approximated contant cost 60% confidence upper limit",
                 &local_bc9);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_8e0,"us",&local_bca);
      psVar21 = &local_8e0;
      tcu::LogNumber<float>::LogNumber
                (&local_5e0,&local_8c0,&local_7e0,psVar21,QP_KEY_TAG_TIME,
                 theilSenFitting.offsetConfidenceUpper);
      tcu::LogNumber<float>::write(&local_5e0,iVar30,__buf_56,(size_t)psVar21);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_900,"ApproximatedLinearCost",&local_bcb);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_800,"Approximated linear cost",&local_bcc);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_920,"us / MB",&local_bcd);
      psVar21 = &local_920;
      tcu::LogNumber<float>::LogNumber
                (&local_350,&local_900,&local_800,psVar21,QP_KEY_TAG_TIME,
                 theilSenFitting.coefficient * 1024.0 * 1024.0);
      tcu::LogNumber<float>::write(&local_350,iVar30,__buf_57,(size_t)psVar21);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_940,"ApproximatedLinearCostConfidence60Lower",&local_bce);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_820,"Approximated linear cost 60% confidence lower limit",
                 &local_bcf);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_960,"us / MB",&local_bd0);
      psVar21 = &local_960;
      tcu::LogNumber<float>::LogNumber
                (&local_578,&local_940,&local_820,psVar21,QP_KEY_TAG_TIME,
                 theilSenFitting.coefficientConfidenceLower * 1024.0 * 1024.0);
      tcu::LogNumber<float>::write(&local_578,iVar30,__buf_58,(size_t)psVar21);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_980,"ApproximatedLinearCostConfidence60Upper",&local_bd1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_840,"Approximated linear cost 60% confidence upper limit",
                 &local_bd2);
      std::__cxx11::string::string<std::allocator<char>>((string *)&section,"us / MB",&local_bd3);
      psVar21 = (string *)&section;
      tcu::LogNumber<float>::LogNumber
                (&local_510,&local_980,&local_840,psVar21,QP_KEY_TAG_TIME,
                 theilSenFitting.coefficientConfidenceUpper * 1024.0 * 1024.0);
      tcu::LogNumber<float>::write(&local_510,iVar30,__buf_59,(size_t)psVar21);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_600,"ApproximatedTransferRate",&local_bd4);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_188,"Approximated transfer rate",&local_bd5);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"MB / s",&local_bd6);
      fVar36 = fVar38 / ((local_87c / 1000.0) / 1000.0);
      local_ab8 = ZEXT416((uint)fVar36);
      psVar21 = &local_228;
      tcu::LogNumber<float>::LogNumber
                (&local_420,&local_600,&local_188,psVar21,QP_KEY_TAG_PERFORMANCE,
                 fVar36 * 0.0009765625 * 0.0009765625);
      tcu::LogNumber<float>::write(&local_420,iVar30,__buf_60,(size_t)psVar21);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_248,"ApproximatedTransferRateNoConstant",&local_bd7);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,"Approximated transfer rate without constant cost",&local_bd8)
      ;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"MB / s",&local_bd9);
      fVar38 = fVar38 / ((local_880 / 1000.0) / 1000.0);
      psVar21 = &local_268;
      tcu::LogNumber<float>::LogNumber
                (&local_668,&local_248,&local_1a8,psVar21,QP_KEY_TAG_PERFORMANCE,
                 fVar38 * 0.0009765625 * 0.0009765625);
      tcu::LogNumber<float>::write(&local_668,iVar30,__buf_61,(size_t)psVar21);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_288,"SampleMedianTime",&local_bda);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,"Median sample time",&local_bdb);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"us",&local_bdc);
      psVar21 = &local_2a8;
      tcu::LogNumber<float>::LogNumber
                (&local_6d0,&local_288,&local_1c8,psVar21,QP_KEY_TAG_TIME,
                 resultStats.result.medianTime);
      tcu::LogNumber<float>::write(&local_6d0,iVar30,__buf_62,(size_t)psVar21);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2c8,"SampleMedianTransfer",&local_bdd);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,"Median transfer rate",&local_bde);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"MB / s",&local_bdf);
      psVar21 = &local_2e8;
      tcu::LogNumber<float>::LogNumber
                (&local_488,&local_2c8,&local_1e8,psVar21,QP_KEY_TAG_PERFORMANCE,
                 resultStats.medianRate * 0.0009765625 * 0.0009765625);
      tcu::LogNumber<float>::write(&local_488,iVar30,__buf_63,(size_t)psVar21);
      tcu::LogNumber<float>::~LogNumber(&local_488);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_2c8);
      tcu::LogNumber<float>::~LogNumber(&local_6d0);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_288);
      tcu::LogNumber<float>::~LogNumber(&local_668);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_248);
      tcu::LogNumber<float>::~LogNumber(&local_420);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_600);
      tcu::LogNumber<float>::~LogNumber(&local_510);
      std::__cxx11::string::~string((string *)&section);
      std::__cxx11::string::~string((string *)&local_840);
      std::__cxx11::string::~string((string *)&local_980);
      tcu::LogNumber<float>::~LogNumber(&local_578);
      std::__cxx11::string::~string((string *)&local_960);
      std::__cxx11::string::~string((string *)&local_820);
      std::__cxx11::string::~string((string *)&local_940);
      tcu::LogNumber<float>::~LogNumber(&local_350);
      std::__cxx11::string::~string((string *)&local_920);
      std::__cxx11::string::~string((string *)&local_800);
      std::__cxx11::string::~string((string *)&local_900);
      tcu::LogNumber<float>::~LogNumber(&local_5e0);
      std::__cxx11::string::~string((string *)&local_8e0);
      std::__cxx11::string::~string((string *)&local_7e0);
      std::__cxx11::string::~string((string *)&local_8c0);
      tcu::LogNumber<float>::~LogNumber(&local_758);
      std::__cxx11::string::~string((string *)&local_8a0);
      std::__cxx11::string::~string((string *)&local_a18);
      std::__cxx11::string::~string((string *)&local_b18);
      tcu::LogNumber<float>::~LogNumber(&local_7c0);
      std::__cxx11::string::~string((string *)&local_bc0);
      std::__cxx11::string::~string((string *)&local_b78);
      std::__cxx11::string::~string((string *)&local_af8);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)local_9f8);
      std::__cxx11::string::~string((string *)&local_ba0);
      std::__cxx11::string::~string((string *)&local_b58);
      std::__cxx11::string::~string((string *)&local_ad8);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&stats);
      std::__cxx11::string::~string((string *)&local_b38);
      std::__cxx11::string::~string((string *)buckets);
      std::__cxx11::string::~string((string *)&contributionFitting);
      tcu::ScopedLogSection::~ScopedLogSection(&section_3);
      UVar42.transferRateAtRange = (float)local_ab8._0_4_;
      UVar42.transferRateMedian = resultStats.medianRate;
      UVar42.transferRateAtInfinity = fVar38;
      return UVar42;
    }
    puVar32 = (undefined8 *)(lVar28 + lVar22);
    local_bc8 = lVar22;
    local_988 = lVar25;
    fVar37 = floorf(((float)(int)(*(int *)(lVar28 + 4 + lVar22) - uVar27) / fVar36) * 4.0);
    uVar17 = (uint)fVar37;
    if (2 < (int)uVar17) {
      uVar17 = 3;
    }
    uVar24 = (ulong)uVar17;
    if ((int)uVar17 < 1) {
      uVar24 = 0;
    }
    pUVar20 = buckets[uVar24].
              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pUVar20 ==
        buckets[uVar24].
        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      pUVar26 = buckets[uVar24].
                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      __n = (long)pUVar20 - (long)pUVar26;
      if (__n == 0x7fffffffffffffc0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar34 = (long)__n >> 6;
      uVar19 = uVar34;
      if (pUVar20 == pUVar26) {
        uVar19 = 1;
      }
      uVar29 = uVar19 + uVar34;
      if (0x1fffffffffffffe < uVar29) {
        uVar29 = 0x1ffffffffffffff;
      }
      if (CARRY8(uVar19,uVar34)) {
        uVar29 = 0x1ffffffffffffff;
      }
      if (uVar29 == 0) {
        pUVar20 = (pointer)0x0;
      }
      else {
        local_990 = pUVar26;
        pUVar20 = (pointer)operator_new(uVar29 << 6);
        pUVar26 = local_990;
      }
      uVar11 = *puVar32;
      uVar12 = puVar32[1];
      uVar13 = puVar32[2];
      uVar14 = puVar32[3];
      uVar8 = puVar32[4];
      uVar9 = puVar32[5];
      uVar15 = puVar32[7];
      *(undefined8 *)((long)(pUVar20 + uVar34) + 0x30) = puVar32[6];
      *(undefined8 *)((long)(pUVar20 + uVar34) + 0x38) = uVar15;
      *(undefined8 *)((long)(pUVar20 + uVar34) + 0x20) = uVar8;
      *(undefined8 *)((long)(pUVar20 + uVar34) + 0x28) = uVar9;
      *(undefined8 *)((long)(pUVar20 + uVar34) + 0x10U) = uVar13;
      ((undefined8 *)((long)(pUVar20 + uVar34) + 0x10U))[1] = uVar14;
      pUVar3 = pUVar20 + uVar34;
      pUVar3->bufferSize = (int)uVar11;
      pUVar3->allocatedSize = (int)((ulong)uVar11 >> 0x20);
      *(undefined8 *)&pUVar3->writtenSize = uVar12;
      if (0 < (long)__n) {
        memmove(pUVar20,pUVar26,__n);
      }
      std::
      _Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
      ::_M_deallocate((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                       *)pUVar26,
                      (pointer)((long)buckets[uVar24].
                                      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)pUVar26 >> 6),(size_t)pUVar26);
      buckets[uVar24].
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pUVar20;
      buckets[uVar24].
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)pUVar20 + __n + 0x40);
      buckets[uVar24].
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pUVar20 + uVar29;
      plVar33 = (long *)local_ab8._0_8_;
      uVar27 = local_4a8._0_4_;
    }
    else {
      pUVar26 = (pointer)*puVar32;
      pUVar3 = (pointer)puVar32[1];
      pUVar4 = (pointer)puVar32[2];
      dVar5 = puVar32[3];
      dVar6 = puVar32[4];
      dVar7 = puVar32[5];
      dVar10 = puVar32[7];
      (pUVar20->duration).totalDuration = puVar32[6];
      (pUVar20->duration).fitResponseDuration = dVar10;
      (pUVar20->duration).writeDuration = dVar6;
      (pUVar20->duration).allocDuration = dVar7;
      (pUVar20->duration).mapDuration = (deUint64)pUVar4;
      (pUVar20->duration).unmapDuration = dVar5;
      (((_Vector_impl *)&pUVar20->bufferSize)->super__Vector_impl_data)._M_start = pUVar26;
      *(pointer *)&pUVar20->writtenSize = pUVar3;
      ppUVar1 = &buckets[uVar24].
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppUVar1 = *ppUVar1 + 1;
    }
    lVar25 = local_988 + 1;
    lVar28 = *plVar33;
    lVar31 = plVar33[1];
    lVar22 = local_bc8 + 0x40;
  } while( true );
}

Assistant:

static UploadSampleAnalyzeResult analyzeSampleResults (tcu::TestLog& log, const std::vector<UploadSampleResult<SampleType> >& samples, bool logBucketPerformance)
{
	// Assume data is linear with some outliers, fit a line
	const LineParametersWithConfidence						theilSenFitting						= fitLineToSamples(samples);
	const typename SampleTypeTraits<SampleType>::StatsType	resultStats							= calculateSampleStatistics(theilSenFitting, samples);
	float													approximatedTransferRate;
	float													approximatedTransferRateNoConstant;

	// Output raw samples
	{
		const tcu::ScopedLogSection	section(log, "Samples", "Samples");
		logSampleList(log, theilSenFitting, samples);
	}

	// Calculate results for different ranges
	if (logBucketPerformance)
	{
		const int										numBuckets				= 4;
		int												minBufferSize			= 0;
		int												maxBufferSize			= 0;
		std::vector<UploadSampleResult<SampleType> >	buckets[numBuckets];

		bucketizeSamplesUniformly(samples, &buckets[0], numBuckets, minBufferSize, maxBufferSize);

		for (int bucketNdx = 0; bucketNdx < numBuckets; ++bucketNdx)
		{
			if (buckets[bucketNdx].empty())
				continue;

			// Print a nice result summary

			const int												bucketRangeMin	= minBufferSize + (int)(((float) bucketNdx    / (float)numBuckets) * (float)(maxBufferSize - minBufferSize));
			const int												bucketRangeMax	= minBufferSize + (int)(((float)(bucketNdx+1) / (float)numBuckets) * (float)(maxBufferSize - minBufferSize));
			const typename SampleTypeTraits<SampleType>::StatsType	stats			= calculateSampleStatistics(theilSenFitting, buckets[bucketNdx]);
			const tcu::ScopedLogSection								section			(log, "BufferSizeRange", std::string("Transfer performance with buffer size in range [").append(getHumanReadableByteSize(bucketRangeMin).append(", ").append(getHumanReadableByteSize(bucketRangeMax).append("]"))));

			logMapRangeStats<SampleType>(log, stats);
			logUnmapStats<SampleType>(log, stats);
			logWriteStats<SampleType>(log, stats);
			logFlushStats<SampleType>(log, stats);
			logAllocStats<SampleType>(log, stats);

			log	<< tcu::TestLog::Float("Min", "Total: Min time", "us", QP_KEY_TAG_TIME, stats.result.minTime)
				<< tcu::TestLog::Float("Max", "Total: Max time", "us", QP_KEY_TAG_TIME, stats.result.maxTime)
				<< tcu::TestLog::Float("Min90", "Total: 90%-Min time", "us", QP_KEY_TAG_TIME, stats.result.min2DecileTime)
				<< tcu::TestLog::Float("Max90", "Total: 90%-Max time", "us", QP_KEY_TAG_TIME, stats.result.max9DecileTime)
				<< tcu::TestLog::Float("Median", "Total: Median time", "us", QP_KEY_TAG_TIME, stats.result.medianTime)
				<< tcu::TestLog::Float("MedianTransfer", "Median transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, stats.medianRate / 1024.0f / 1024.0f)
				<< tcu::TestLog::Float("MaxDiff", "Max difference to approximated", "us", QP_KEY_TAG_TIME, stats.maxDiffTime)
				<< tcu::TestLog::Float("Max90Diff", "90%-Max difference to approximated", "us", QP_KEY_TAG_TIME, stats.maxDiff9DecileTime)
				<< tcu::TestLog::Float("MedianDiff", "Median difference to approximated", "us", QP_KEY_TAG_TIME, stats.medianDiffTime)
				<< tcu::TestLog::Float("MaxRelDiff", "Max relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.maxRelDiffTime * 100.0f)
				<< tcu::TestLog::Float("Max90RelDiff", "90%-Max relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.max9DecileRelDiffTime * 100.0f)
				<< tcu::TestLog::Float("MedianRelDiff", "Median relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.medianRelDiffTime * 100.0f);
		}
	}

	// Contributions
	if (SampleTypeTraits<SampleType>::LOG_CONTRIBUTIONS)
	{
		const tcu::ScopedLogSection	section(log, "Contribution", "Contributions");

		logMapContribution(log, samples, resultStats);
		logUnmapContribution(log, samples, resultStats);
		logWriteContribution(log, samples, resultStats);
		logFlushContribution(log, samples, resultStats);
		logAllocContribution(log, samples, resultStats);
	}

	// Print results
	{
		const tcu::ScopedLogSection	section(log, "Results", "Results");

		const int	medianBufferSize					= (samples.front().bufferSize + samples.back().bufferSize) / 2;
		const float	approximatedTransferTime			= (theilSenFitting.offset + theilSenFitting.coefficient * (float)medianBufferSize) / 1000.0f / 1000.0f;
		const float	approximatedTransferTimeNoConstant	= (theilSenFitting.coefficient * (float)medianBufferSize) / 1000.0f / 1000.0f;
		const float	sampleLinearity						= calculateSampleFitLinearity(samples);
		const float	sampleTemporalStability				= calculateSampleTemporalStability(samples);

		approximatedTransferRateNoConstant				= (float)medianBufferSize / approximatedTransferTimeNoConstant;
		approximatedTransferRate						= (float)medianBufferSize / approximatedTransferTime;

		log	<< tcu::TestLog::Float("ResultLinearity", "Sample linearity", "%", QP_KEY_TAG_QUALITY, sampleLinearity * 100.0f)
			<< tcu::TestLog::Float("SampleTemporalStability", "Sample temporal stability", "%", QP_KEY_TAG_QUALITY, sampleTemporalStability * 100.0f)
			<< tcu::TestLog::Float("ApproximatedConstantCost", "Approximated contant cost", "us", QP_KEY_TAG_TIME, theilSenFitting.offset)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Lower", "Approximated contant cost 60% confidence lower limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceLower)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Upper", "Approximated contant cost 60% confidence upper limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceUpper)
			<< tcu::TestLog::Float("ApproximatedLinearCost", "Approximated linear cost", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficient * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Lower", "Approximated linear cost 60% confidence lower limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceLower * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Upper", "Approximated linear cost 60% confidence upper limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceUpper * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedTransferRate", "Approximated transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedTransferRate / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("ApproximatedTransferRateNoConstant", "Approximated transfer rate without constant cost", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedTransferRateNoConstant / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("SampleMedianTime", "Median sample time", "us", QP_KEY_TAG_TIME, resultStats.result.medianTime)
			<< tcu::TestLog::Float("SampleMedianTransfer", "Median transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, resultStats.medianRate / 1024.0f / 1024.0f);
	}

	// return approximated transfer rate
	{
		UploadSampleAnalyzeResult result;

		result.transferRateMedian = resultStats.medianRate;
		result.transferRateAtRange = approximatedTransferRate;
		result.transferRateAtInfinity = approximatedTransferRateNoConstant;

		return result;
	}
}